

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O0

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,char *data,size_t length,string *decoded,size_t id)

{
  bool bVar1;
  allocator local_51;
  string local_50;
  size_t local_30;
  size_t id_local;
  string *decoded_local;
  size_t length_local;
  char *data_local;
  cmProcessOutput *this_local;
  
  local_30 = id;
  id_local = (size_t)decoded;
  decoded_local = (string *)length;
  length_local = (size_t)data;
  data_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,data,length,&local_51);
  bVar1 = DecodeText(this,&local_50,(string *)id_local,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return bVar1;
}

Assistant:

bool cmProcessOutput::DecodeText(const char* data, size_t length,
                                 std::string& decoded, size_t id)
{
  return this->DecodeText(std::string(data, length), decoded, id);
}